

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O1

int lj_cf_os_exit(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  uint __status;
  
  if ((L->base < L->top) && (aVar1 = L->base->field_4, ((long)aVar1 >> 0x2f) + 3U < 2)) {
    __status = (uint)(aVar1.it >> 0xf == 0x1fffe);
  }
  else {
    __status = lj_lib_optint(L,1,0);
  }
  if ((L->base + 1 < L->top) && (*(short *)((long)L->base + 0xe) != -1)) {
    lua_close(L);
  }
  exit(__status);
}

Assistant:

LJLIB_CF(os_exit)
{
  int status;
  if (L->base < L->top && tvisbool(L->base))
    status = boolV(L->base) ? EXIT_SUCCESS : EXIT_FAILURE;
  else
    status = lj_lib_optint(L, 1, EXIT_SUCCESS);
  if (L->base+1 < L->top && tvistruecond(L->base+1))
    lua_close(L);
  exit(status);
  return 0;  /* Unreachable. */
}